

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_YAFluxRegister.cpp
# Opt level: O1

void __thiscall
amrex::YAFluxRegister::CrseAdd
          (YAFluxRegister *this,MFIter *mfi,array<const_amrex::FArrayBox_*,_3UL> *flux,Real *dx,
          Real dt,RunOn runon)

{
  double dVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  FArrayBox *pFVar9;
  FArrayBox *pFVar10;
  FArrayBox *pFVar11;
  int *piVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  double *pdVar16;
  double *pdVar17;
  double *pdVar18;
  long lVar19;
  long lVar20;
  double *pdVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  double *pdVar27;
  long lVar28;
  double *pdVar29;
  long lVar30;
  ulong uVar31;
  double *pdVar32;
  long lVar33;
  long lVar34;
  long lVar35;
  double *pdVar36;
  Array4<double> fab;
  Array4<int> flag;
  long local_2b8;
  long local_2a0;
  double *local_270;
  double *local_268;
  double *local_260;
  double *local_258;
  double *local_250;
  double *local_248;
  double *local_228;
  double *local_220;
  double *local_218;
  double *local_210;
  double *local_208;
  double *local_200;
  double *local_1e8;
  double *local_1e0;
  double *local_1d8;
  double *local_1d0;
  double *local_1c8;
  double *local_1c0;
  Box local_f4;
  double local_d8;
  double local_c8;
  Array4<double> local_b0;
  Array4<int> local_70;
  
  piVar12 = &mfi->currentIndex;
  if (mfi->local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
    piVar12 = (mfi->local_index_map->super_vector<int,_std::allocator<int>_>).
              super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
              + *piVar12;
  }
  if ((this->m_crse_fab_flag).super_vector<int,_std::allocator<int>_>.
      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
      [*piVar12] != 0) {
    MFIter::tilebox(&local_f4,mfi);
    local_c8 = dt / *dx;
    local_d8 = dt / dx[1];
    dVar1 = dx[2];
    uVar2 = (this->m_crse_data).super_FabArray<amrex::FArrayBox>.super_FabArrayBase.n_comp;
    uVar13 = (ulong)uVar2;
    pFVar9 = flux->_M_elems[0];
    pFVar10 = flux->_M_elems[1];
    pFVar11 = flux->_M_elems[2];
    FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              (&local_b0,(FabArray<amrex::FArrayBox> *)this,mfi);
    FabArray<amrex::IArrayBox>::array<amrex::IArrayBox,_0>
              (&local_70,&(this->m_crse_flag).super_FabArray<amrex::IArrayBox>,mfi);
    local_2b8 = (long)local_f4.smallend.vect[2];
    if (local_f4.smallend.vect[2] <= local_f4.bigend.vect[2]) {
      local_250 = (pFVar9->super_BaseFab<double>).dptr;
      iVar3 = (pFVar9->super_BaseFab<double>).domain.smallend.vect[0];
      iVar4 = (pFVar9->super_BaseFab<double>).domain.smallend.vect[1];
      iVar5 = (pFVar9->super_BaseFab<double>).domain.smallend.vect[2];
      lVar14 = (long)(((pFVar9->super_BaseFab<double>).domain.bigend.vect[0] - iVar3) + 1);
      lVar22 = (long)(((pFVar9->super_BaseFab<double>).domain.bigend.vect[1] - iVar4) + 1);
      iVar6 = (pFVar10->super_BaseFab<double>).domain.smallend.vect[0];
      iVar7 = (pFVar10->super_BaseFab<double>).domain.smallend.vect[1];
      iVar8 = (pFVar10->super_BaseFab<double>).domain.smallend.vect[2];
      lVar26 = (long)local_f4.smallend.vect[1] * 8;
      lVar35 = (long)local_f4.smallend.vect[0];
      lVar28 = ((local_2b8 - iVar5) * lVar22 * 8 + lVar26 + (long)iVar4 * -8) * lVar14 + lVar35 * 8
               + (long)iVar3 * -8;
      lVar22 = lVar22 * lVar14;
      lVar23 = lVar22 * (((pFVar9->super_BaseFab<double>).domain.bigend.vect[2] - iVar5) + 1);
      local_248 = (double *)((long)local_250 + lVar28);
      local_250 = (double *)((long)local_250 + lVar28 + 8);
      lVar19 = (long)(((pFVar10->super_BaseFab<double>).domain.bigend.vect[1] - iVar7) + 1);
      lVar28 = (local_2b8 - iVar8) * lVar19 * 8 + lVar26 + (long)iVar7 * -8;
      lVar30 = (long)(((pFVar10->super_BaseFab<double>).domain.bigend.vect[0] - iVar6) + 1);
      lVar19 = lVar19 * lVar30;
      lVar20 = lVar19 * (((pFVar10->super_BaseFab<double>).domain.bigend.vect[2] - iVar8) + 1);
      local_260 = (pFVar10->super_BaseFab<double>).dptr;
      local_258 = (double *)(lVar28 * lVar30 + lVar35 * 8 + (long)iVar6 * -8 + (long)local_260);
      local_260 = (double *)
                  ((lVar28 + 8) * lVar30 + lVar35 * 8 + (long)iVar6 * -8 + (long)local_260);
      iVar3 = (pFVar11->super_BaseFab<double>).domain.smallend.vect[0];
      lVar34 = (long)(((pFVar11->super_BaseFab<double>).domain.bigend.vect[0] - iVar3) + 1);
      iVar4 = (pFVar11->super_BaseFab<double>).domain.smallend.vect[1];
      lVar28 = (long)(((pFVar11->super_BaseFab<double>).domain.bigend.vect[1] - iVar4) + 1);
      iVar5 = (pFVar11->super_BaseFab<double>).domain.smallend.vect[2];
      lVar24 = lVar28 * lVar34;
      lVar25 = lVar24 * (((pFVar11->super_BaseFab<double>).domain.bigend.vect[2] - iVar5) + 1);
      local_270 = (pFVar11->super_BaseFab<double>).dptr;
      local_268 = (double *)
                  (((local_2b8 - iVar5) * lVar28 * 8 + lVar26 + (long)iVar4 * -8) * lVar34 +
                   lVar35 * 8 + (long)iVar3 * -8 + (long)local_270);
      local_270 = (double *)
                  ((((local_2b8 - iVar5) + 1) * lVar28 * 8 + lVar26 + (long)iVar4 * -8) * lVar34 +
                   lVar35 * 8 + (long)iVar3 * -8 + (long)local_270);
      do {
        if (local_f4.smallend.vect[1] <= local_f4.bigend.vect[1]) {
          lVar26 = (local_2b8 - local_70.begin.z) * local_70.kstride;
          local_200 = local_270;
          local_208 = local_268;
          local_210 = local_260;
          local_218 = local_258;
          local_220 = local_250;
          local_228 = local_248;
          local_2a0 = (long)local_f4.smallend.vect[1];
          do {
            if (local_f4.smallend.vect[0] <= local_f4.bigend.vect[0]) {
              lVar15 = (local_2a0 - local_70.begin.y) * local_70.jstride;
              pdVar17 = local_b0.p +
                        lVar35 + (((local_2b8 - local_b0.begin.z) * local_b0.kstride +
                                  (local_2a0 - local_b0.begin.y) * local_b0.jstride) -
                                 (long)local_b0.begin.x);
              local_1c0 = local_200;
              local_1c8 = local_208;
              local_1d8 = local_210;
              local_1e8 = local_218;
              pdVar18 = local_228;
              pdVar21 = pdVar17;
              lVar28 = lVar35;
              pdVar27 = pdVar17;
              pdVar29 = pdVar17;
              pdVar36 = local_220;
              local_1e0 = pdVar17;
              local_1d0 = pdVar17;
              do {
                lVar33 = lVar28 - local_70.begin.x;
                if (local_70.p[lVar15 + lVar33 + lVar26] == 1) {
                  pdVar16 = pdVar27;
                  uVar31 = uVar13;
                  pdVar32 = pdVar18;
                  if (local_70.p[lVar15 + lVar26 + (~local_70.begin.x + (int)lVar28)] == 2 &&
                      0 < (int)uVar2) {
                    do {
                      *pdVar16 = *pdVar32 * -local_c8 + *pdVar16;
                      uVar31 = uVar31 - 1;
                      pdVar16 = pdVar16 + local_b0.nstride;
                      pdVar32 = pdVar32 + lVar23;
                    } while (uVar31 != 0);
                  }
                  pdVar16 = pdVar29;
                  uVar31 = uVar13;
                  pdVar32 = pdVar36;
                  if (local_70.p[lVar15 + lVar26 + lVar33 + 1] == 2 && 0 < (int)uVar2) {
                    do {
                      *pdVar16 = *pdVar32 * local_c8 + *pdVar16;
                      uVar31 = uVar31 - 1;
                      pdVar16 = pdVar16 + local_b0.nstride;
                      pdVar32 = pdVar32 + lVar23;
                    } while (uVar31 != 0);
                  }
                  pdVar16 = pdVar17;
                  uVar31 = uVar13;
                  pdVar32 = local_1e8;
                  if (local_70.p
                      [lVar26 + (~local_70.begin.y + (int)local_2a0) * local_70.jstride + lVar33] ==
                      2 && 0 < (int)uVar2) {
                    do {
                      *pdVar16 = *pdVar32 * -local_d8 + *pdVar16;
                      uVar31 = uVar31 - 1;
                      pdVar16 = pdVar16 + local_b0.nstride;
                      pdVar32 = pdVar32 + lVar20;
                    } while (uVar31 != 0);
                  }
                  pdVar16 = local_1e0;
                  uVar31 = uVar13;
                  pdVar32 = local_1d8;
                  if (local_70.p
                      [lVar26 + ((local_2a0 - local_70.begin.y) + 1) * local_70.jstride + lVar33] ==
                      2 && 0 < (int)uVar2) {
                    do {
                      *pdVar16 = *pdVar32 * local_d8 + *pdVar16;
                      uVar31 = uVar31 - 1;
                      pdVar16 = pdVar16 + local_b0.nstride;
                      pdVar32 = pdVar32 + lVar20;
                    } while (uVar31 != 0);
                  }
                  pdVar16 = local_1d0;
                  uVar31 = uVar13;
                  pdVar32 = local_1c8;
                  if (local_70.p
                      [lVar15 + lVar33 + (~local_70.begin.z + (int)local_2b8) * local_70.kstride] ==
                      2 && 0 < (int)uVar2) {
                    do {
                      *pdVar16 = *pdVar32 * -(dt / dVar1) + *pdVar16;
                      uVar31 = uVar31 - 1;
                      pdVar16 = pdVar16 + local_b0.nstride;
                      pdVar32 = pdVar32 + lVar25;
                    } while (uVar31 != 0);
                  }
                  pdVar16 = pdVar21;
                  uVar31 = uVar13;
                  pdVar32 = local_1c0;
                  if (local_70.p
                      [lVar15 + lVar33 + ((local_2b8 - local_70.begin.z) + 1) * local_70.kstride] ==
                      2 && 0 < (int)uVar2) {
                    do {
                      *pdVar16 = *pdVar32 * (dt / dVar1) + *pdVar16;
                      uVar31 = uVar31 - 1;
                      pdVar16 = pdVar16 + local_b0.nstride;
                      pdVar32 = pdVar32 + lVar25;
                    } while (uVar31 != 0);
                  }
                }
                lVar28 = lVar28 + 1;
                pdVar27 = pdVar27 + 1;
                pdVar18 = pdVar18 + 1;
                pdVar29 = pdVar29 + 1;
                pdVar36 = pdVar36 + 1;
                pdVar17 = pdVar17 + 1;
                local_1e8 = local_1e8 + 1;
                local_1e0 = local_1e0 + 1;
                local_1d8 = local_1d8 + 1;
                local_1d0 = local_1d0 + 1;
                local_1c8 = local_1c8 + 1;
                pdVar21 = pdVar21 + 1;
                local_1c0 = local_1c0 + 1;
              } while (local_f4.bigend.vect[0] + 1 != (int)lVar28);
            }
            local_2a0 = local_2a0 + 1;
            local_228 = local_228 + lVar14;
            local_220 = local_220 + lVar14;
            local_218 = local_218 + lVar30;
            local_210 = local_210 + lVar30;
            local_208 = local_208 + lVar34;
            local_200 = local_200 + lVar34;
          } while (local_f4.bigend.vect[1] + 1 != (int)local_2a0);
        }
        local_2b8 = local_2b8 + 1;
        local_248 = local_248 + lVar22;
        local_250 = local_250 + lVar22;
        local_258 = local_258 + lVar19;
        local_260 = local_260 + lVar19;
        local_268 = local_268 + lVar24;
        local_270 = local_270 + lVar24;
      } while (local_f4.bigend.vect[2] + 1 != (int)local_2b8);
    }
  }
  return;
}

Assistant:

void
YAFluxRegister::CrseAdd (const MFIter& mfi,
                         const std::array<FArrayBox const*, AMREX_SPACEDIM>& flux,
                         const Real* dx, Real dt, RunOn runon) noexcept
{
    BL_ASSERT(m_crse_data.nComp() == flux[0]->nComp());

    if (m_crse_fab_flag[mfi.LocalIndex()] == crse_cell) {
        return;  // this coarse fab is not close to fine fabs.
    }

    const Box& bx = mfi.tilebox();
    const int nc = m_crse_data.nComp();
    AMREX_D_TERM(const Real dtdx = dt/dx[0];,
                 const Real dtdy = dt/dx[1];,
                 const Real dtdz = dt/dx[2];);
    AMREX_D_TERM(FArrayBox const* fx = flux[0];,
                 FArrayBox const* fy = flux[1];,
                 FArrayBox const* fz = flux[2];);

    auto fab = m_crse_data.array(mfi);
    auto const flag = m_crse_flag.array(mfi);

    AMREX_D_TERM(Array4<Real const> fxarr = fx->const_array();,
                 Array4<Real const> fyarr = fy->const_array();,
                 Array4<Real const> fzarr = fz->const_array(););

    AMREX_LAUNCH_HOST_DEVICE_LAMBDA_FLAG ( runon, bx, tbx,
    {
        yafluxreg_crseadd(tbx, fab, flag, AMREX_D_DECL(fxarr,fyarr,fzarr),
                          AMREX_D_DECL(dtdx,dtdy,dtdz),nc);
    });
}